

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,ZeroCopyOutputStream *output,FieldReporterLevel reporter)

{
  bool bVar1;
  undefined1 local_50 [8];
  TextGenerator generator;
  FieldReporterLevel reporter_local;
  ZeroCopyOutputStream *output_local;
  Message *message_local;
  Printer *this_local;
  
  generator.initial_indent_level_ = reporter;
  TextGenerator::TextGenerator
            ((TextGenerator *)local_50,output,(bool)(this->insert_silent_marker_ & 1),
             this->initial_indent_level_);
  internal::PrintTextMarker
            ((BaseTextGenerator *)local_50,(bool)(this->redact_debug_string_ & 1),
             (bool)(this->randomize_debug_string_ & 1),(bool)(this->single_line_mode_ & 1));
  Print(this,message,(BaseTextGenerator *)local_50);
  bVar1 = TextGenerator::failed((TextGenerator *)local_50);
  TextGenerator::~TextGenerator((TextGenerator *)local_50);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool TextFormat::Printer::Print(const Message& message,
                                io::ZeroCopyOutputStream* output,
                                internal::FieldReporterLevel reporter) const {
  TextGenerator generator(output, insert_silent_marker_, initial_indent_level_);

  internal::PrintTextMarker(&generator, redact_debug_string_,
                            randomize_debug_string_, single_line_mode_);


  Print(message, &generator);

  // Output false if the generator failed internally.
  return !generator.failed();
}